

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_dec.c
# Opt level: O1

int pgx_getc(jas_stream_t *in)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  
  while( true ) {
    uVar3 = 0xffffffff;
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar1 = in->cnt_;
        in->cnt_ = iVar1 + -1;
        if (iVar1 < 1) {
          uVar3 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar2 = in->ptr_;
          in->ptr_ = pbVar2 + 1;
          uVar3 = (uint)*pbVar2;
        }
      }
      else {
        in->flags_ = in->flags_ | 4;
      }
    }
    if (uVar3 != 0x23) break;
    while( true ) {
      uVar3 = 0xffffffff;
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar1 = in->cnt_;
          in->cnt_ = iVar1 + -1;
          if (iVar1 < 1) {
            uVar3 = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar2 = in->ptr_;
            in->ptr_ = pbVar2 + 1;
            uVar3 = (uint)*pbVar2;
          }
        }
        else {
          in->flags_ = in->flags_ | 4;
        }
      }
      if ((uVar3 == 0xd) || (uVar3 == 10)) break;
      if (uVar3 == 0xffffffff) {
        return -1;
      }
    }
  }
  return uVar3;
}

Assistant:

static int pgx_getc(jas_stream_t *in)
{
	int c;
	for (;;) {
		if ((c = jas_stream_getc(in)) == EOF) {
			return -1;
		}
		if (c != '#') {
			return c;
		}
		do {
			if ((c = jas_stream_getc(in)) == EOF) {
				return -1;
			}
		} while (c != '\n' && c != '\r');
	}
}